

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O0

void icu_63::double_conversion::InitialScaledStartValues
               (uint64_t significand,int exponent,bool lower_boundary_is_closer,int estimated_power,
               bool need_boundary_deltas,Bignum *numerator,Bignum *denominator,Bignum *delta_minus,
               Bignum *delta_plus)

{
  Bignum *numerator_local;
  bool need_boundary_deltas_local;
  int estimated_power_local;
  bool lower_boundary_is_closer_local;
  int exponent_local;
  uint64_t significand_local;
  
  if (exponent < 0) {
    if (estimated_power < 0) {
      InitialScaledStartValuesNegativeExponentNegativePower
                (significand,exponent,estimated_power,need_boundary_deltas,numerator,denominator,
                 delta_minus,delta_plus);
    }
    else {
      InitialScaledStartValuesNegativeExponentPositivePower
                (significand,exponent,estimated_power,need_boundary_deltas,numerator,denominator,
                 delta_minus,delta_plus);
    }
  }
  else {
    InitialScaledStartValuesPositiveExponent
              (significand,exponent,estimated_power,need_boundary_deltas,numerator,denominator,
               delta_minus,delta_plus);
  }
  if ((need_boundary_deltas) && (lower_boundary_is_closer)) {
    Bignum::ShiftLeft(denominator,1);
    Bignum::ShiftLeft(numerator,1);
    Bignum::ShiftLeft(delta_plus,1);
  }
  return;
}

Assistant:

static void InitialScaledStartValues(uint64_t significand,
                                     int exponent,
                                     bool lower_boundary_is_closer,
                                     int estimated_power,
                                     bool need_boundary_deltas,
                                     Bignum* numerator,
                                     Bignum* denominator,
                                     Bignum* delta_minus,
                                     Bignum* delta_plus) {
  if (exponent >= 0) {
    InitialScaledStartValuesPositiveExponent(
        significand, exponent, estimated_power, need_boundary_deltas,
        numerator, denominator, delta_minus, delta_plus);
  } else if (estimated_power >= 0) {
    InitialScaledStartValuesNegativeExponentPositivePower(
        significand, exponent, estimated_power, need_boundary_deltas,
        numerator, denominator, delta_minus, delta_plus);
  } else {
    InitialScaledStartValuesNegativeExponentNegativePower(
        significand, exponent, estimated_power, need_boundary_deltas,
        numerator, denominator, delta_minus, delta_plus);
  }

  if (need_boundary_deltas && lower_boundary_is_closer) {
    // The lower boundary is closer at half the distance of "normal" numbers.
    // Increase the common denominator and adapt all but the delta_minus.
    denominator->ShiftLeft(1);  // *2
    numerator->ShiftLeft(1);    // *2
    delta_plus->ShiftLeft(1);   // *2
  }
}